

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall cppforth::Forth::opendashblocks(Forth *this)

{
  uint uVar1;
  uint src;
  uint address;
  uint size;
  Forth *this_local;
  
  requireDStackDepth(this,2,"OPEN-BLOCKS");
  uVar1 = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  src = ForthStack<unsigned_int>::getTop(&this->dStack);
  ForthStack<unsigned_int>::pop(&this->dStack);
  flush(this);
  moveFromDataSpace(this,&this->blockFileName,src,(ulong)uVar1);
  return;
}

Assistant:

void opendashblocks() {
			REQUIRE_DSTACK_DEPTH(2, "OPEN-BLOCKS");
			auto size = dStack.getTop(); dStack.pop();
			auto address = dStack.getTop(); dStack.pop();
			flush();
			moveFromDataSpace(blockFileName, address, size);
		}